

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void amrex::FArrayBox::Initialize(void)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  FABio *rd;
  undefined **ppuVar4;
  _func_int **pp_Var5;
  RealDescriptor *pRVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar7;
  undefined4 extraout_var_02;
  int __flags;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  __fn *__fn;
  char *pcVar8;
  void *in_R8;
  string fmt;
  string ord;
  ParmParse pp;
  undefined4 extraout_var;
  
  if (initialized != '\0') {
    return;
  }
  initialized = 1;
  std::__cxx11::string::string((string *)&fmt,"fab",(allocator *)&ord);
  ParmParse::ParmParse(&pp,&fmt);
  std::__cxx11::string::~string((string *)&fmt);
  fmt._M_dataplus._M_p = (pointer)&fmt.field_2;
  fmt._M_string_length = 0;
  fmt.field_2._M_local_buf[0] = '\0';
  __fn = (__fn *)0x6f9ed3;
  __flags = 0;
  iVar3 = ParmParse::query(&pp,"format",&fmt,0);
  if (iVar3 == 0) {
    format = 2;
    rd = (FABio *)operator_new(0x10);
    pRVar6 = FPC::NativeRealDescriptor();
    iVar3 = RealDescriptor::clone(pRVar6,__fn,__child_stack,__flags,in_R8);
    pp_Var5 = (_func_int **)CONCAT44(extraout_var,iVar3);
LAB_00517d56:
    rd->_vptr_FABio = (_func_int **)&PTR__FABio_binary_007d3e50;
    rd[1]._vptr_FABio = pp_Var5;
  }
  else {
    bVar2 = std::operator==(&fmt,"ASCII");
    if (bVar2) {
      format = 0;
      rd = (FABio *)operator_new(8);
      ppuVar4 = &PTR__FABio_007d3e98;
    }
    else {
      bVar2 = std::operator==(&fmt,"8BIT");
      if (!bVar2) {
        pcVar8 = "NATIVE";
        bVar2 = std::operator==(&fmt,"NATIVE");
        if (bVar2) {
          format = 2;
          rd = (FABio *)operator_new(0x10);
          pRVar6 = FPC::NativeRealDescriptor();
          iVar3 = RealDescriptor::clone(pRVar6,(__fn *)pcVar8,__child_stack_00,__flags,in_R8);
          pp_Var5 = (_func_int **)CONCAT44(extraout_var_00,iVar3);
        }
        else {
          pcVar8 = "NATIVE_32";
          bVar2 = std::operator==(&fmt,"NATIVE_32");
          if (bVar2) {
            format = 6;
            rd = (FABio *)operator_new(0x10);
            pRVar6 = FPC::Native32RealDescriptor();
            iVar3 = RealDescriptor::clone(pRVar6,(__fn *)pcVar8,__child_stack_01,__flags,in_R8);
            pp_Var5 = (_func_int **)CONCAT44(extraout_var_01,iVar3);
          }
          else {
            bVar2 = std::operator==(&fmt,"IEEE");
            if ((!bVar2) && (bVar2 = std::operator==(&fmt,"IEEE32"), !bVar2)) {
              poVar7 = ErrorStream();
              poVar7 = std::operator<<(poVar7,"FArrayBox::init(): Bad FABio::Format = ");
              std::operator<<(poVar7,(string *)&fmt);
              rd = (FABio *)0x0;
              Abort_host((char *)0x0);
              goto LAB_00517d9c;
            }
            pcVar8 = "IEEE";
            bVar2 = std::operator==(&fmt,"IEEE");
            format = (uint)!bVar2 * 4 + 1;
            rd = (FABio *)operator_new(0x10);
            pRVar6 = FPC::Ieee32NormalRealDescriptor();
            iVar3 = RealDescriptor::clone(pRVar6,(__fn *)pcVar8,__child_stack_02,__flags,in_R8);
            pp_Var5 = (_func_int **)CONCAT44(extraout_var_02,iVar3);
          }
        }
        goto LAB_00517d56;
      }
      format = 4;
      rd = (FABio *)operator_new(8);
      ppuVar4 = &PTR__FABio_007d3f50;
    }
    rd->_vptr_FABio = (_func_int **)ppuVar4;
  }
LAB_00517d9c:
  setFABio(rd);
  ord._M_dataplus._M_p = (pointer)&ord.field_2;
  ord._M_string_length = 0;
  ord.field_2._M_local_buf[0] = '\0';
  iVar3 = ParmParse::query(&pp,"ordering",&ord,0);
  uVar1 = ordering;
  if (iVar3 != 0) {
    bVar2 = std::operator==(&ord,"NORMAL_ORDER");
    uVar1 = 0;
    if (!bVar2) {
      bVar2 = std::operator==(&ord,"REVERSE_ORDER");
      if (bVar2) {
        uVar1 = 1;
      }
      else {
        bVar2 = std::operator==(&ord,"REVERSE_ORDER_2");
        if (bVar2) {
          uVar1 = 2;
        }
        else {
          poVar7 = ErrorStream();
          poVar7 = std::operator<<(poVar7,"FArrayBox::init(): Bad FABio::Ordering = ");
          std::operator<<(poVar7,(string *)&ord);
          Abort_host((char *)0x0);
          uVar1 = ordering;
        }
      }
    }
  }
  ordering = uVar1;
  initval = 0x7ff8000000000000;
  ParmParse::queryAdd<double,_0>(&pp,"initval",(double *)&initval);
  ParmParse::queryAdd<bool,_0>(&pp,"do_initval",(bool *)&do_initval);
  ParmParse::queryAdd<bool,_0>(&pp,"init_snan",(bool *)&init_snan);
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x517eca);
  std::__cxx11::string::~string((string *)&ord);
  std::__cxx11::string::~string((string *)&fmt);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
FArrayBox::Initialize ()
{
    if (initialized) return;
    initialized = true;

    BL_ASSERT(fabio == 0);

    ParmParse pp("fab");

    std::string fmt;
    //
    // This block can legitimately set FAB output format.
    //
    if (pp.query("format", fmt))
    {
        FABio* fio = 0;

        if (fmt == "ASCII")
        {
            FArrayBox::format = FABio::FAB_ASCII;
            fio = new FABio_ascii;
        }
        else if (fmt == "8BIT")
        {
            FArrayBox::format = FABio::FAB_8BIT;
            fio = new FABio_8bit;
        }
        else if (fmt == "NATIVE")
        {
            FArrayBox::format = FABio::FAB_NATIVE;
            fio = new FABio_binary(FPC::NativeRealDescriptor().clone());
        }
        else if (fmt == "NATIVE_32")
        {
            FArrayBox::format = FABio::FAB_NATIVE_32;
            fio = new FABio_binary(FPC::Native32RealDescriptor().clone());
        }
        else if (fmt == "IEEE" || fmt == "IEEE32")
        {
            if (fmt == "IEEE")
            {
                FArrayBox::format = FABio::FAB_IEEE;
                //amrex::Warning("IEEE fmt in ParmParse files is deprecated");
            }
            else
            {
                FArrayBox::format = FABio::FAB_IEEE_32;
            }
            fio = new FABio_binary(FPC::Ieee32NormalRealDescriptor().clone());
        }
        else
        {
            amrex::ErrorStream() << "FArrayBox::init(): Bad FABio::Format = " << fmt;
            amrex::Abort();
        }

        setFABio(fio);
    }
    else
    {
        //
        // We default to "NATIVE" if nothing is specified.
        //
        FArrayBox::format = FABio::FAB_NATIVE;

        setFABio(new FABio_binary(FPC::NativeRealDescriptor().clone()));
    }
    //
    // This block sets ordering which doesn't affect output format.
    // It is only used when reading in an old FAB.
    //
    std::string ord;

    if (pp.query("ordering", ord))
    {
        if (ord == "NORMAL_ORDER")
            FArrayBox::setOrdering(FABio::FAB_NORMAL_ORDER);
        else if (ord == "REVERSE_ORDER")
            FArrayBox::setOrdering(FABio::FAB_REVERSE_ORDER);
        else if (ord == "REVERSE_ORDER_2")
            FArrayBox::setOrdering(FABio::FAB_REVERSE_ORDER_2);
        else
        {
            amrex::ErrorStream() << "FArrayBox::init(): Bad FABio::Ordering = " << ord;
            amrex::Abort();
        }
    }

    initval = std::numeric_limits<Real>::has_quiet_NaN
            ? std::numeric_limits<Real>::quiet_NaN()
            : std::numeric_limits<Real>::max();

    pp.queryAdd("initval",    initval);
    pp.queryAdd("do_initval", do_initval);
    pp.queryAdd("init_snan", init_snan);

    amrex::ExecOnFinalize(FArrayBox::Finalize);
}